

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim>::emplaceRealloc<>
          (SmallVectorBase<slang::ast::ForeachLoopStatement::LoopDim> *this,pointer pos)

{
  ulong uVar1;
  _Storage<slang::ConstantRange,_true> *p_Var2;
  undefined8 uVar3;
  _Storage<slang::ConstantRange,_true> _Var4;
  pointer pLVar5;
  pointer pLVar6;
  size_type sVar7;
  pointer pLVar8;
  long lVar9;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar9 = (long)pos - (long)this->data_;
  pLVar5 = (pointer)detail::allocArray(capacity,0x18);
  *(undefined8 *)((long)pLVar5 + lVar9) = 0;
  ((undefined8 *)((long)pLVar5 + lVar9))[1] = 0;
  *(undefined8 *)((long)pLVar5 + lVar9 + 0x10) = 0;
  pLVar6 = this->data_;
  sVar7 = this->len;
  if (pLVar6 + sVar7 == pos) {
    pLVar8 = pLVar5;
    if (sVar7 != 0) {
      do {
        pLVar8->loopVar = pLVar6->loopVar;
        uVar3 = *(undefined8 *)
                 &(pLVar6->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_engaged;
        (pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_payload =
             (pLVar6->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ConstantRange>._M_payload;
        *(undefined8 *)
         &(pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar3;
        pLVar6 = pLVar6 + 1;
        pLVar8 = pLVar8 + 1;
      } while (pLVar6 != pos);
    }
  }
  else {
    pLVar8 = pLVar5;
    if (pLVar6 != pos) {
      do {
        pLVar8->loopVar = pLVar6->loopVar;
        uVar3 = *(undefined8 *)
                 &(pLVar6->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_engaged;
        (pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::ConstantRange>._M_payload =
             (pLVar6->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ConstantRange>._M_payload;
        *(undefined8 *)
         &(pLVar8->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ConstantRange>._M_engaged = uVar3;
        pLVar6 = pLVar6 + 1;
        pLVar8 = pLVar8 + 1;
      } while (pLVar6 != pos);
      pLVar6 = this->data_;
      sVar7 = this->len;
    }
    if (pLVar6 + sVar7 != pos) {
      p_Var2 = (_Storage<slang::ConstantRange,_true> *)((long)pLVar5 + lVar9);
      do {
        p_Var2[5] = (_Storage<slang::ConstantRange,_true>)pos->loopVar;
        _Var4 = *(_Storage<slang::ConstantRange,_true> *)
                 &(pos->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                  super__Optional_payload_base<slang::ConstantRange>._M_engaged;
        p_Var2[3] = (pos->range).super__Optional_base<slang::ConstantRange,_true,_true>._M_payload.
                    super__Optional_payload_base<slang::ConstantRange>._M_payload;
        p_Var2[4] = _Var4;
        pos = pos + 1;
        p_Var2 = p_Var2 + 3;
      } while (pos != pLVar6 + sVar7);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pLVar5;
  return (pointer)((long)pLVar5 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}